

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O1

void __thiscall
Trainer::Trainer<Kuhn::Game>::writeStrategyToBin(Trainer<Kuhn::Game> *this,int iteration)

{
  pointer pcVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  pointer pcVar5;
  bool bVar6;
  Trainer<Kuhn::Game> *pTVar7;
  uint uVar8;
  uint8_t uVar9;
  byte bVar10;
  double *pdVar11;
  ostream *poVar12;
  long *plVar13;
  uint uVar14;
  long *plVar15;
  size_type *psVar16;
  ulong uVar17;
  uint __len;
  _Hash_node_base *p_Var18;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  binary_oarchive oa;
  ofstream ofs;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  Trainer<Kuhn::Game> *local_2d8;
  long *local_2d0 [2];
  long local_2c0 [2];
  undefined1 local_2b0 [40];
  basic_binary_oprimitive<boost::archive::binary_oarchive,char,std::char_traits<char>>
  local_288 [56];
  long *local_250 [2];
  long local_240 [2];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_2d8 = this;
  for (p_Var2 = (this->mNodeMap)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    p_Var3 = p_Var2[2]._M_nxt;
    if (p_Var3 != (_Hash_node_base *)0x0) {
      p_Var4 = p_Var2[1]._M_nxt;
      p_Var18 = (_Hash_node_base *)0x0;
      do {
        std::ostream::operator<<
                  ((ostream *)&std::cout,
                   (int)*(char *)((long)&p_Var18->_M_nxt + (long)&p_Var4->_M_nxt));
        p_Var18 = (_Hash_node_base *)((long)&p_Var18->_M_nxt + 1);
      } while (p_Var3 != p_Var18);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    uVar9 = Node::actionNum((Node *)p_Var2[5]._M_nxt);
    if (uVar9 != '\0') {
      uVar17 = 0;
      do {
        pdVar11 = Node::averageStrategy((Node *)p_Var2[5]._M_nxt);
        poVar12 = std::ostream::_M_insert<double>(pdVar11[uVar17]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
        uVar17 = uVar17 + 1;
        bVar10 = Node::actionNum((Node *)p_Var2[5]._M_nxt);
      } while (uVar17 < bVar10);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  if (iteration < 1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"strategy","");
  }
  else {
    __len = 1;
    if (9 < (uint)iteration) {
      uVar14 = iteration;
      uVar8 = 4;
      do {
        __len = uVar8;
        if (uVar14 < 100) {
          __len = __len - 2;
          goto LAB_00114007;
        }
        if (uVar14 < 1000) {
          __len = __len - 1;
          goto LAB_00114007;
        }
        if (uVar14 < 10000) goto LAB_00114007;
        bVar6 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar8 = __len + 4;
      } while (bVar6);
      __len = __len + 1;
    }
LAB_00114007:
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct((ulong)local_250,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_250[0],__len,iteration);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x1195d5);
    local_2f8 = &local_2e8;
    plVar15 = plVar13 + 2;
    if ((long *)*plVar13 == plVar15) {
      local_2e8 = *plVar15;
      lStack_2e0 = plVar13[3];
    }
    else {
      local_2e8 = *plVar15;
      local_2f8 = (long *)*plVar13;
    }
    local_2f0 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
  }
  pTVar7 = local_2d8;
  if ((0 < iteration) && (local_250[0] != local_240)) {
    operator_delete(local_250[0],local_240[0] + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,"_",
                 pTVar7->mModeStr);
  plVar13 = (long *)std::__cxx11::string::append(local_2b0);
  plVar15 = plVar13 + 2;
  if ((long *)*plVar13 == plVar15) {
    local_220 = *plVar15;
    lStack_218 = plVar13[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar15;
    local_230 = (long *)*plVar13;
  }
  local_228 = plVar13[1];
  *plVar13 = (long)plVar15;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_230);
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  pcVar1 = local_2b0 + 0x10;
  if ((pointer)local_2b0._0_8_ != pcVar1) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  pcVar5 = (pTVar7->mFolderPath)._M_dataplus._M_p;
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d0,pcVar5,pcVar5 + (pTVar7->mFolderPath)._M_string_length);
  std::__cxx11::string::append((char *)local_2d0);
  plVar13 = (long *)std::__cxx11::string::_M_append((char *)local_2d0,(ulong)local_2f8);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_2b0._16_8_ = *psVar16;
    local_2b0._24_8_ = plVar13[3];
    local_2b0._0_8_ = pcVar1;
  }
  else {
    local_2b0._16_8_ = *psVar16;
    local_2b0._0_8_ = (size_type *)*plVar13;
  }
  local_2b0._8_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(&local_230,(string *)local_2b0,_S_out);
  if ((pointer)local_2b0._0_8_ != pcVar1) {
    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  boost::archive::binary_oarchive::binary_oarchive
            ((binary_oarchive *)local_2b0,(ostream *)&local_230,0);
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::binary_oarchive,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>_>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object
            (local_2b0,(basic_oserializer *)&pTVar7->mNodeMap);
  std::ofstream::close();
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_2b0);
  boost::archive::
  basic_binary_oprimitive<boost::archive::binary_oarchive,char,std::char_traits<char>>::
  ~basic_binary_oprimitive(local_288);
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + _VTT[-3]) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  return;
}

Assistant:

void Trainer<T>::writeStrategyToBin(const int iteration) const {
    for (auto &itr : mNodeMap) {
        for (char c : itr.first) {
            std::cout << int(c);
        }
        std::cout << ":";
        for (int i = 0; i < itr.second->actionNum(); ++i) {
            std::cout << itr.second->averageStrategy()[i] << ",";
        }
        std::cout << std::endl;
    }
    std::string path = iteration > 0 ? "strategy_" + std::to_string(iteration)
                                     : "strategy";
    path += "_" + mModeStr + ".bin";
    std::ofstream ofs(mFolderPath + "/" + path);
    boost::archive::binary_oarchive oa(ofs);
    oa << mNodeMap;
    ofs.close();
}